

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

float_specs
fmt::v9::detail::parse_float_type_spec<fmt::v9::detail::error_handler,char>
          (basic_format_specs<char> *specs,error_handler *eh)

{
  long in_RDI;
  float_specs result;
  char *in_stack_ffffffffffffffd8;
  float_specs local_8;
  
  local_8._4_4_ = (*(ushort *)(in_RDI + 9) & 0x80) << 0xc | (*(byte *)(in_RDI + 10) & 1) << 0x11;
  switch((error_handler *)(ulong)*(byte *)(in_RDI + 8)) {
  case (error_handler *)0x0:
    local_8 = (float_specs)((ulong)(uint)local_8._4_4_ << 0x20);
    break;
  default:
    error_handler::on_error((error_handler *)(ulong)*(byte *)(in_RDI + 8),in_stack_ffffffffffffffd8)
    ;
  case (error_handler *)0x8:
    local_8._4_4_ = local_8._4_4_ | 0x10000;
  case (error_handler *)0x7:
    local_8 = (float_specs)((ulong)(uint)local_8._4_4_ << 0x20 | 0x300000000);
    break;
  case (error_handler *)0xa:
    local_8._4_4_ = local_8._4_4_ | 0x10000;
  case (error_handler *)0x9:
    local_8 = (float_specs)
              ((ulong)(local_8._4_4_ & 0xfff7ffff | 1 |
                      (uint)((uint)local_8._4_4_ >> 0x13 != 0 || *(int *)(in_RDI + 4) != 0) << 0x13)
              << 0x20);
    break;
  case (error_handler *)0xc:
    local_8._4_4_ = local_8._4_4_ | 0x10000;
  case (error_handler *)0xb:
    local_8 = (float_specs)
              ((ulong)(local_8._4_4_ & 0xfff7ffff | 2 |
                      (uint)((uint)local_8._4_4_ >> 0x13 != 0 || *(int *)(in_RDI + 4) != 0) << 0x13)
              << 0x20);
    break;
  case (error_handler *)0xe:
    local_8._4_4_ = local_8._4_4_ | 0x10000;
  case (error_handler *)0xd:
    local_8 = (float_specs)((ulong)(uint)local_8._4_4_ << 0x20);
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR auto parse_float_type_spec(const basic_format_specs<Char>& specs,
                                         ErrorHandler&& eh = {})
    -> float_specs {
  auto result = float_specs();
  result.showpoint = specs.alt;
  result.locale = specs.localized;
  switch (specs.type) {
  case presentation_type::none:
    result.format = float_format::general;
    break;
  case presentation_type::general_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::general_lower:
    result.format = float_format::general;
    break;
  case presentation_type::exp_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::exp_lower:
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case presentation_type::fixed_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::fixed_lower:
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
  case presentation_type::hexfloat_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::hexfloat_lower:
    result.format = float_format::hex;
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
  return result;
}